

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O3

void __thiscall anurbs::RTree<3L>::finish(RTree<3L> *this,bool hilbert_sort)

{
  pointer pMVar1;
  pointer *ppuVar2;
  pointer puVar3;
  size_type __n;
  pointer pMVar4;
  long lVar5;
  long lVar6;
  pointer pMVar7;
  double dVar8;
  long lVar9;
  size_t sVar10;
  runtime_error *this_00;
  ulong uVar11;
  long lVar12;
  pointer plVar13;
  pointer plVar14;
  long lVar15;
  Index k;
  long lVar16;
  long lVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hilbert_values;
  Vector node_min;
  Vector box_max;
  Vector box_min;
  Vector size;
  VectorU center;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  VectorU local_b8;
  double local_98 [4];
  double local_78 [4];
  double local_58 [4];
  unsigned_long local_38;
  double dStack_30;
  double local_28;
  
  __n = this->m_nb_items;
  if ((long)__n < this->m_position) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"More items then expected");
  }
  else {
    if ((long)__n <= this->m_position) {
      local_58[0] = (this->m_max).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[0] -
                    (this->m_min).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[0];
      local_58[1] = (this->m_max).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[1] -
                    (this->m_min).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[1];
      local_58[2] = (this->m_max).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[2] -
                    (this->m_min).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                    m_storage.m_data.array[2];
      if (hilbert_sort) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_d8,__n,(allocator_type *)&local_b8);
        lVar9 = this->m_nb_items;
        if (0 < lVar9) {
          lVar16 = 0;
          do {
            pMVar4 = (this->m_boxes_min).
                     super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_78[2] = *(double *)
                           ((long)&pMVar4[lVar16].
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                   m_storage.m_data + 0x10);
            pMVar4 = pMVar4 + lVar16;
            local_78[0] = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[0];
            local_78[1] = *(double *)
                           ((long)&(pMVar4->
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                                   m_storage.m_data + 8);
            pMVar4 = (this->m_boxes_max).
                     super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_98[2] = *(double *)
                           ((long)&pMVar4[lVar16].
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                   m_storage.m_data + 0x10);
            pMVar4 = pMVar4 + lVar16;
            local_98[0] = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data.array[0];
            local_98[1] = *(double *)
                           ((long)&(pMVar4->
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                                   m_storage.m_data + 8);
            lVar9 = 0;
            do {
              dVar8 = (((*(double *)((long)local_78 + lVar9) + *(double *)((long)local_98 + lVar9))
                        * 0.5 - *(double *)
                                 ((long)(this->m_min).
                                        super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                        .m_storage.m_data.array + lVar9)) /
                      *(double *)((long)local_58 + lVar9)) * 2097152.0;
              uVar11 = (ulong)dVar8;
              *(ulong *)((long)&local_38 + lVar9) =
                   (long)(dVar8 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
              lVar9 = lVar9 + 8;
            } while (lVar9 != 0x18);
            local_b8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[2] = (unsigned_long)local_28;
            local_b8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[0] = local_38;
            local_b8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[1] = (unsigned_long)dStack_30;
            sVar10 = HilbertCurve<3L>::index_at(0x15,&local_b8);
            local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar16] = sVar10;
            lVar16 = lVar16 + 1;
            lVar9 = this->m_nb_items;
          } while (lVar16 < lVar9);
        }
        sort(this,&local_d8,0,lVar9 + -1);
        if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      plVar13 = (this->m_level_bounds).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar14 = (this->m_level_bounds).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (8 < (long)plVar14 - (long)plVar13) {
        lVar16 = 0;
        lVar9 = 0;
        do {
          lVar5 = plVar13[lVar16];
          lVar12 = lVar9;
          if (lVar9 < lVar5) {
            do {
              lVar9 = 0;
              do {
                local_b8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.
                m_storage.m_data.array[lVar9] = 0x7ff0000000000000;
                (&local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start)[lVar9] = (pointer)0xfff0000000000000;
                lVar9 = lVar9 + 1;
              } while (lVar9 != 3);
              lVar6 = this->m_node_size;
              pMVar4 = (this->m_boxes_min).
                       super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar9 = lVar12;
              if ((0 < lVar6) && (lVar12 < lVar5)) {
                pMVar7 = (this->m_boxes_max).
                         super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar15 = 0;
                do {
                  local_78[2] = *(double *)
                                 ((long)&pMVar4[lVar9].
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                         .m_storage.m_data + 0x10);
                  local_78[0] = pMVar4[lVar9].
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                m_storage.m_data.array[0];
                  local_78[1] = *(double *)
                                 ((long)&pMVar4[lVar9].
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                         .m_storage.m_data + 8);
                  local_98[2] = *(double *)
                                 ((long)&pMVar7[lVar9].
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                         .m_storage.m_data + 0x10);
                  pMVar1 = pMVar7 + lVar9;
                  local_98[0] = (pMVar1->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                                m_storage.m_data.array[0];
                  local_98[1] = *(double *)
                                 ((long)&(pMVar1->
                                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                                         ).m_storage.m_data + 8);
                  lVar17 = 0;
                  do {
                    if (local_78[lVar17] <
                        (double)local_b8.
                                super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.
                                m_storage.m_data.array[lVar17]) {
                      local_b8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.
                      m_storage.m_data.array[lVar17] = (unsigned_long)local_78[lVar17];
                    }
                    puVar3 = (pointer)local_98[lVar17];
                    ppuVar2 = &local_d8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17;
                    if ((double)*ppuVar2 <= (double)puVar3 && (double)puVar3 != (double)*ppuVar2) {
                      (&local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start)[lVar17] = puVar3;
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  lVar9 = lVar9 + 1;
                  lVar15 = lVar15 + 1;
                } while ((lVar15 < lVar6) && (lVar9 < lVar5));
              }
              (this->m_indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[this->m_position] = lVar12;
              lVar12 = this->m_position;
              *(unsigned_long *)
               &pMVar4[lVar12].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                m_storage.m_data =
                   local_b8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array[0];
              *(unsigned_long *)
               ((long)&pMVar4[lVar12].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                       m_storage.m_data + 8) =
                   local_b8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array[1];
              *(unsigned_long *)
               ((long)&pMVar4[lVar12].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                       m_storage.m_data + 0x10) =
                   local_b8.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array[2];
              lVar12 = this->m_position;
              pMVar7 = (this->m_boxes_max).
                       super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pMVar4 = pMVar7 + lVar12;
              *(pointer *)
               &(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                m_data = local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              *(pointer *)
               ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                       m_storage.m_data + 8) =
                   local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&pMVar7[lVar12].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                       m_storage.m_data + 0x10) =
                   local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              this->m_position = this->m_position + 1;
              lVar12 = lVar9;
            } while (lVar9 < lVar5);
            plVar13 = (this->m_level_bounds).super__Vector_base<long,_std::allocator<long>_>._M_impl
                      .super__Vector_impl_data._M_start;
            plVar14 = (this->m_level_bounds).super__Vector_base<long,_std::allocator<long>_>._M_impl
                      .super__Vector_impl_data._M_finish;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < ((long)plVar14 - (long)plVar13 >> 3) + -1);
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Less items then expected");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void finish(const bool hilbert_sort)
    {
        if (m_position > m_nb_items) {
            throw std::runtime_error("More items then expected");
        }
        if (m_position < m_nb_items) {
            throw std::runtime_error("Less items then expected");
        }

        const Vector size = m_max - m_min;

        if (hilbert_sort) {
        std::vector<size_t> hilbert_values(m_nb_items);

        for (Index i = 0; i < m_nb_items; i++) {
            Vector box_min = m_boxes_min[i];
            Vector box_max = m_boxes_max[i];

            VectorU center;

            for (Index j = 0; j < dimension(); j++) {
                center[j] = ((box_min[j] + box_max[j]) / 2 - m_min[j]) / size[j] * HilbertCurve<TDimension>::max_axis_size();
            }

            hilbert_values[i] = HilbertCurve<TDimension>::index_at(center);
        }

        sort(hilbert_values, 0, m_nb_items - 1);
        }

        Index pos = 0;

        for (Index i = 0; i < length(m_level_bounds) - 1; i++) {
            Index end = m_level_bounds[i];

            while (pos < end) {
                Vector node_min;
                Vector node_max;

                for (Index j = 0; j < TDimension; j++) {
                    node_min[j] = Infinity;
                    node_max[j] = -Infinity;
                }

                Index node_index = pos;

                for (Index j = 0; j < m_node_size && pos < end; j++) {
                    Vector box_min = m_boxes_min[pos];
                    Vector box_max = m_boxes_max[pos];

                    pos += 1;

                    for (Index k = 0; k < dimension(); k++) {
                        if (box_min[k] < node_min[k]) {
                            node_min[k] = box_min[k];
                        }
                        if (box_max[k] > node_max[k]) {
                            node_max[k] = box_max[k];
                        }
                    }
                }

                m_indices[m_position] = node_index;
                m_boxes_min[m_position] = node_min;
                m_boxes_max[m_position] = node_max;

                m_position += 1;
            }
        }
    }